

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void * alcGetProcAddress(ALCdevice *_device,ALCchar *funcname)

{
  int iVar1;
  code *x;
  DeviceWrapper *device;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetProcAddress);
  IO_UINT64((uint64)_device);
  IO_STRING(funcname);
  if ((((funcname != (ALCchar *)0x0) && (*funcname == 'a')) && (funcname[1] == 'l')) &&
     (funcname[2] == 'c')) {
    iVar1 = strcmp(funcname,"alcGetCurrentContext");
    if (iVar1 == 0) {
      x = alcGetCurrentContext;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcGetContextsDevice");
    if (iVar1 == 0) {
      x = alcGetContextsDevice;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcIsExtensionPresent");
    if (iVar1 == 0) {
      x = alcIsExtensionPresent;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcGetProcAddress");
    if (iVar1 == 0) {
      x = alcGetProcAddress;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcGetEnumValue");
    if (iVar1 == 0) {
      x = alcGetEnumValue;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcGetString");
    if (iVar1 == 0) {
      x = alcGetString;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCaptureOpenDevice");
    if (iVar1 == 0) {
      x = alcCaptureOpenDevice;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCaptureCloseDevice");
    if (iVar1 == 0) {
      x = alcCaptureCloseDevice;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcOpenDevice");
    if (iVar1 == 0) {
      x = alcOpenDevice;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCloseDevice");
    if (iVar1 == 0) {
      x = alcCloseDevice;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCreateContext");
    if (iVar1 == 0) {
      x = alcCreateContext;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcMakeContextCurrent");
    if (iVar1 == 0) {
      x = alcMakeContextCurrent;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcProcessContext");
    if (iVar1 == 0) {
      x = alcProcessContext;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcSuspendContext");
    if (iVar1 == 0) {
      x = alcSuspendContext;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcDestroyContext");
    if (iVar1 == 0) {
      x = alcDestroyContext;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcGetError");
    if (iVar1 == 0) {
      x = alcGetError;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcGetIntegerv");
    if (iVar1 == 0) {
      x = alcGetIntegerv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCaptureStart");
    if (iVar1 == 0) {
      x = alcCaptureStart;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCaptureStop");
    if (iVar1 == 0) {
      x = alcCaptureStop;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcCaptureSamples");
    if (iVar1 == 0) {
      x = alcCaptureSamples;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alDopplerFactor");
    if (iVar1 == 0) {
      x = alDopplerFactor;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alDopplerVelocity");
    if (iVar1 == 0) {
      x = alDopplerVelocity;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSpeedOfSound");
    if (iVar1 == 0) {
      x = alSpeedOfSound;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alDistanceModel");
    if (iVar1 == 0) {
      x = alDistanceModel;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alEnable");
    if (iVar1 == 0) {
      x = alEnable;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alDisable");
    if (iVar1 == 0) {
      x = alDisable;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alIsEnabled");
    if (iVar1 == 0) {
      x = alIsEnabled;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetString");
    if (iVar1 == 0) {
      x = alGetString;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBooleanv");
    if (iVar1 == 0) {
      x = alGetBooleanv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetIntegerv");
    if (iVar1 == 0) {
      x = alGetIntegerv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetFloatv");
    if (iVar1 == 0) {
      x = alGetFloatv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetDoublev");
    if (iVar1 == 0) {
      x = alGetDoublev;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBoolean");
    if (iVar1 == 0) {
      x = alGetBoolean;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetInteger");
    if (iVar1 == 0) {
      x = alGetInteger;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetFloat");
    if (iVar1 == 0) {
      x = alGetFloat;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetDouble");
    if (iVar1 == 0) {
      x = alGetDouble;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alIsExtensionPresent");
    if (iVar1 == 0) {
      x = alIsExtensionPresent;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetError");
    if (iVar1 == 0) {
      x = alGetError;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetProcAddress");
    if (iVar1 == 0) {
      x = alGetProcAddress;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetEnumValue");
    if (iVar1 == 0) {
      x = alGetEnumValue;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alListenerfv");
    if (iVar1 == 0) {
      x = alListenerfv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alListenerf");
    if (iVar1 == 0) {
      x = alListenerf;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alListener3f");
    if (iVar1 == 0) {
      x = alListener3f;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alListeneriv");
    if (iVar1 == 0) {
      x = alListeneriv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alListeneri");
    if (iVar1 == 0) {
      x = alListeneri;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alListener3i");
    if (iVar1 == 0) {
      x = alListener3i;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetListenerfv");
    if (iVar1 == 0) {
      x = alGetListenerfv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetListenerf");
    if (iVar1 == 0) {
      x = alGetListenerf;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetListener3f");
    if (iVar1 == 0) {
      x = alGetListener3f;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetListeneri");
    if (iVar1 == 0) {
      x = alGetListeneri;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetListeneriv");
    if (iVar1 == 0) {
      x = alGetListeneriv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetListener3i");
    if (iVar1 == 0) {
      x = alGetListener3i;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGenSources");
    if (iVar1 == 0) {
      x = alGenSources;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alDeleteSources");
    if (iVar1 == 0) {
      x = alDeleteSources;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alIsSource");
    if (iVar1 == 0) {
      x = alIsSource;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcefv");
    if (iVar1 == 0) {
      x = alSourcefv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcef");
    if (iVar1 == 0) {
      x = alSourcef;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSource3f");
    if (iVar1 == 0) {
      x = alSource3f;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceiv");
    if (iVar1 == 0) {
      x = alSourceiv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcei");
    if (iVar1 == 0) {
      x = alSourcei;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSource3i");
    if (iVar1 == 0) {
      x = alSource3i;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetSourcefv");
    if (iVar1 == 0) {
      x = alGetSourcefv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetSourcef");
    if (iVar1 == 0) {
      x = alGetSourcef;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetSource3f");
    if (iVar1 == 0) {
      x = alGetSource3f;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetSourceiv");
    if (iVar1 == 0) {
      x = alGetSourceiv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetSourcei");
    if (iVar1 == 0) {
      x = alGetSourcei;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetSource3i");
    if (iVar1 == 0) {
      x = alGetSource3i;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcePlay");
    if (iVar1 == 0) {
      x = alSourcePlay;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcePlayv");
    if (iVar1 == 0) {
      x = alSourcePlayv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcePause");
    if (iVar1 == 0) {
      x = alSourcePause;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourcePausev");
    if (iVar1 == 0) {
      x = alSourcePausev;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceRewind");
    if (iVar1 == 0) {
      x = alSourceRewind;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceRewindv");
    if (iVar1 == 0) {
      x = alSourceRewindv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceStop");
    if (iVar1 == 0) {
      x = alSourceStop;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceStopv");
    if (iVar1 == 0) {
      x = alSourceStopv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceQueueBuffers");
    if (iVar1 == 0) {
      x = alSourceQueueBuffers;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alSourceUnqueueBuffers");
    if (iVar1 == 0) {
      x = alSourceUnqueueBuffers;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGenBuffers");
    if (iVar1 == 0) {
      x = alGenBuffers;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alDeleteBuffers");
    if (iVar1 == 0) {
      x = alDeleteBuffers;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alIsBuffer");
    if (iVar1 == 0) {
      x = alIsBuffer;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBufferData");
    if (iVar1 == 0) {
      x = alBufferData;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBufferfv");
    if (iVar1 == 0) {
      x = alBufferfv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBufferf");
    if (iVar1 == 0) {
      x = alBufferf;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBuffer3f");
    if (iVar1 == 0) {
      x = alBuffer3f;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBufferiv");
    if (iVar1 == 0) {
      x = alBufferiv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBufferi");
    if (iVar1 == 0) {
      x = alBufferi;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alBuffer3i");
    if (iVar1 == 0) {
      x = alBuffer3i;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBufferfv");
    if (iVar1 == 0) {
      x = alGetBufferfv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBufferf");
    if (iVar1 == 0) {
      x = alGetBufferf;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBuffer3f");
    if (iVar1 == 0) {
      x = alGetBuffer3f;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBufferi");
    if (iVar1 == 0) {
      x = alGetBufferi;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBuffer3i");
    if (iVar1 == 0) {
      x = alGetBuffer3i;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alGetBufferiv");
    if (iVar1 == 0) {
      x = alGetBufferiv;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alTracePushScope");
    if (iVar1 == 0) {
      x = alTracePushScope;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alTracePopScope");
    if (iVar1 == 0) {
      x = alTracePopScope;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alTraceMessage");
    if (iVar1 == 0) {
      x = alTraceMessage;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alTraceBufferLabel");
    if (iVar1 == 0) {
      x = alTraceBufferLabel;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alTraceSourceLabel");
    if (iVar1 == 0) {
      x = alTraceSourceLabel;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcTraceDeviceLabel");
    if (iVar1 == 0) {
      x = alcTraceDeviceLabel;
      goto LAB_00104b57;
    }
    iVar1 = strcmp(funcname,"alcTraceContextLabel");
    if (iVar1 == 0) {
      x = alcTraceContextLabel;
      goto LAB_00104b57;
    }
  }
  x = (code *)0x0;
LAB_00104b57:
  device = &null_device;
  if (_device != (ALCdevice *)0x0) {
    device = (DeviceWrapper *)_device;
  }
  IO_UINT64((uint64)x);
  check_alc_error_events(device);
  check_al_async_states();
  APIUNLOCK();
  return x;
}

Assistant:

void *alcGetProcAddress(ALCdevice *_device, const ALCchar *funcname)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    void *retval = NULL;
    IO_START(alcGetProcAddress);
    IO_PTR(_device);
    IO_STRING(funcname);

    // always return our entry points, so the app always calls through here.
    if (!funcname || ((funcname[0] != 'a') || (funcname[1] != 'l') || (funcname[2] != 'c'))) {
        // !!! FIXME: should set an error state.
        retval = NULL;
    }
    #define ENTRYPOINT(ret,fn,params,args,numargs,visitparams,visitargs) else if (strcmp(funcname, #fn) == 0) { retval = (void *) fn; }
    #include "altrace_entrypoints.h"

    IO_PTR(retval);
    IO_END_ALC(device);
    return retval;

}